

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall
wasm::OptimizeInstructions::optimizeAddedConstants(wasm::Binary*)::ZeroRemover::visitBinary(wasm::
Binary__(void *this,Binary *curr)

{
  Expression **ppEVar1;
  BinaryOp BVar2;
  ulong uVar3;
  uintptr_t uVar4;
  bool bVar5;
  bool bVar6;
  Id IVar7;
  Expression **ppEVar8;
  Expression *pEVar9;
  byte bVar10;
  Expression *expression;
  EffectAnalyzer local_318;
  EffectAnalyzer local_1a8;
  Expression **local_38;
  
  uVar3 = (curr->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id;
  if ((uVar3 & 0xfffffffffffffffe) != 2) {
    return;
  }
  expression = curr->left;
  if (curr->left->_id != ConstId) {
    expression = (Expression *)0x0;
  }
  pEVar9 = (Expression *)0x0;
  if (curr->right->_id == ConstId) {
    pEVar9 = curr->right;
  }
  if (6 < uVar3) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  ppEVar1 = &curr->left;
  BVar2 = curr->op;
  ppEVar8 = &curr->right;
  if (BVar2 == *(BinaryOp *)(&DAT_00b8f0c0 + uVar3 * 4)) {
    if ((expression == (Expression *)0x0) ||
       (bVar5 = Literal::isZero((Literal *)(expression + 1)), !bVar5)) {
      if (pEVar9 == (Expression *)0x0) {
        return;
      }
      bVar5 = Literal::isZero((Literal *)(pEVar9 + 1));
      ppEVar8 = ppEVar1;
      if (!bVar5) {
        return;
      }
    }
  }
  else {
    if (BVar2 != *(BinaryOp *)(&DAT_00b8f028 + uVar3 * 4)) {
      if (BVar2 != *(BinaryOp *)(&DAT_00b8f044 + uVar3 * 4)) {
        return;
      }
      local_38 = ppEVar1;
      if ((expression == (Expression *)0x0) ||
         (bVar5 = Literal::isZero((Literal *)(expression + 1)), !bVar5)) {
        bVar5 = false;
        bVar10 = 0;
      }
      else {
        EffectAnalyzer::EffectAnalyzer
                  (&local_1a8,*(PassOptions **)((long)this + 0xd8),*(Module **)((long)this + 0xd0),
                   *ppEVar8);
        bVar5 = true;
        bVar6 = true;
        if (local_1a8.trap == false) {
          bVar6 = EffectAnalyzer::hasNonTrapSideEffects(&local_1a8);
        }
        bVar10 = bVar6 ^ 1;
      }
      if (bVar5) {
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_1a8.delegateTargets._M_t);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_1a8.breakTargets._M_t);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_1a8.globalsWritten._M_t);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::~_Rb_tree(&local_1a8.mutableGlobalsRead._M_t);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&local_1a8.localsWritten._M_t);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree(&local_1a8.localsRead._M_t);
        if (local_1a8.funcEffectsMap.
            super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1a8.funcEffectsMap.
                     super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
      }
      ppEVar1 = local_38;
      if (bVar10 == 0) {
        if ((pEVar9 == (Expression *)0x0) ||
           (bVar5 = Literal::isZero((Literal *)(pEVar9 + 1)), !bVar5)) {
          bVar5 = false;
          bVar10 = 0;
        }
        else {
          EffectAnalyzer::EffectAnalyzer
                    (&local_318,*(PassOptions **)((long)this + 0xd8),*(Module **)((long)this + 0xd0)
                     ,*ppEVar1);
          bVar5 = true;
          bVar6 = true;
          if (local_318.trap == false) {
            bVar6 = EffectAnalyzer::hasNonTrapSideEffects(&local_318);
          }
          bVar10 = bVar6 ^ 1;
        }
        if (bVar5) {
          EffectAnalyzer::~EffectAnalyzer(&local_318);
        }
        expression = pEVar9;
        if (bVar10 == 0) {
          return;
        }
      }
      goto LAB_0080c9db;
    }
    if ((expression == (Expression *)0x0) ||
       (bVar5 = Literal::isZero((Literal *)(expression + 1)), !bVar5)) {
      if (pEVar9 != (Expression *)0x0) {
        if (pEVar9->_id != ConstId) {
          __assert_fail("int(_id) == int(T::SpecificId)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                        ,0x314,"T *wasm::Expression::cast() [T = wasm::Const]");
        }
        uVar4 = (pEVar9->type).id;
        if (uVar4 == 3) {
          if (*(long *)(pEVar9 + 2) != 3) {
            __assert_fail("type == Type::i64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                          ,0x121,"int64_t wasm::Literal::geti64() const");
          }
          IVar7 = pEVar9[1]._id & ArrayNewId;
        }
        else {
          if (uVar4 != 2) {
            handle_unreachable("unexpected type",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                               ,0x4a);
          }
          if (*(long *)(pEVar9 + 2) != 2) {
            __assert_fail("type == Type::i32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                          ,0x118,"int32_t wasm::Literal::geti32() const");
          }
          IVar7 = pEVar9[1]._id & SIMDShuffleId;
        }
        if (IVar7 == InvalidId) goto LAB_0080c9f8;
      }
      bVar5 = false;
LAB_0080c972:
      bVar6 = bVar5;
      bVar10 = 0;
    }
    else {
LAB_0080c9f8:
      EffectAnalyzer::EffectAnalyzer
                (&local_1a8,*(PassOptions **)((long)this + 0xd8),*(Module **)((long)this + 0xd0),
                 *ppEVar8);
      bVar5 = true;
      bVar6 = true;
      bVar10 = 0;
      if ((local_1a8.trap == false) &&
         (local_1a8.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
        bVar10 = 0;
        if ((local_1a8.danglingPop == false) &&
           (bVar10 = 0,
           local_1a8.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
          if (((((local_1a8.writesMemory != false) || (local_1a8.writesTable != false)) ||
               (local_1a8.writesStruct != false)) ||
              ((local_1a8.writesArray != false || (local_1a8.isAtomic != false)))) ||
             (local_1a8.calls != false)) goto LAB_0080c972;
          bVar10 = 0;
          if ((local_1a8.throws_ == false) &&
             (bVar10 = 0,
             local_1a8.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) {
            bVar10 = ~local_1a8.branchesOut &
                     local_1a8.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
          }
        }
      }
    }
    if (bVar6) {
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.delegateTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.breakTargets._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.globalsWritten._M_t);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree(&local_1a8.mutableGlobalsRead._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_1a8.localsWritten._M_t);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_1a8.localsRead._M_t);
      if (local_1a8.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1a8.funcEffectsMap.
                   super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    ppEVar8 = ppEVar1;
    if (bVar10 == 0) {
      return;
    }
  }
  expression = *ppEVar8;
LAB_0080c9db:
  Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_>::replaceCurrent
            ((Walker<ZeroRemover,_wasm::Visitor<ZeroRemover,_void>_> *)this,expression);
  return;
}

Assistant:

void visitBinary(Binary* curr) {
        if (!curr->type.isInteger()) {
          return;
        }
        auto type = curr->type;
        auto* left = curr->left->dynCast<Const>();
        auto* right = curr->right->dynCast<Const>();
        // Canonicalization prefers an add instead of a subtract wherever
        // possible. That prevents a subtracted constant on the right,
        // as it would be added. And for a zero on the left, it can't be
        // removed (it is how we negate ints).
        if (curr->op == Abstract::getBinary(type, Abstract::Add)) {
          if (left && left->value.isZero()) {
            replaceCurrent(curr->right);
            return;
          }
          if (right && right->value.isZero()) {
            replaceCurrent(curr->left);
            return;
          }
        } else if (curr->op == Abstract::getBinary(type, Abstract::Shl)) {
          // shifting a 0 is a 0, or anything by 0 has no effect, all unless the
          // shift has side effects
          if (((left && left->value.isZero()) ||
               (right && Bits::getEffectiveShifts(right) == 0)) &&
              !EffectAnalyzer(passOptions, *getModule(), curr->right)
                 .hasSideEffects()) {
            replaceCurrent(curr->left);
            return;
          }
        } else if (curr->op == Abstract::getBinary(type, Abstract::Mul)) {
          // multiplying by zero is a zero, unless the other side has side
          // effects
          if (left && left->value.isZero() &&
              !EffectAnalyzer(passOptions, *getModule(), curr->right)
                 .hasSideEffects()) {
            replaceCurrent(left);
            return;
          }
          if (right && right->value.isZero() &&
              !EffectAnalyzer(passOptions, *getModule(), curr->left)
                 .hasSideEffects()) {
            replaceCurrent(right);
            return;
          }
        }
      }